

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

void __thiscall google::protobuf::MapValueRef::SetInt32Value(MapValueRef *this,int32_t value)

{
  CppType CVar1;
  LogMessage *this_00;
  LogMessageFatal local_40 [16];
  char *local_30;
  char *local_28;
  
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 == CPPTYPE_INT32) {
    *(int32_t *)(this->super_MapValueConstRef).data_ = value;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map_field.h"
             ,0x34a);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_40,0x21,"Protocol Buffer map usage error:\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_40,0x1a,"MapValueRef::SetInt32Value");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_40,0x15," type does not match\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (local_40,0xd,"  Expected : ");
  local_28 = (char *)0x346d11;
  this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                      ((LogMessage *)local_40,&local_28);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(this_00,1,"\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (this_00,0xd,"  Actual   : ");
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  local_30 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8);
  absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>(this_00,&local_30);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

void SetInt32Value(int32_t value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32, "MapValueRef::SetInt32Value");
    *reinterpret_cast<int32_t*>(data_) = value;
  }